

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

int trex_parsenumber(TRex *exp)

{
  char *pcVar1;
  ushort **ppuVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  
  pcVar1 = exp->_p;
  iVar4 = *pcVar1 + -0x30;
  pcVar5 = pcVar1 + 1;
  exp->_p = pcVar5;
  ppuVar2 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar2 + (long)pcVar1[1] * 2 + 1) & 8) != 0) {
    iVar3 = 10;
    do {
      exp->_p = pcVar5 + 1;
      if (iVar3 == 1000000000) {
        if (exp->_error != (char **)0x0) {
          *exp->_error = "overflow in numeric constant";
        }
        longjmp((__jmp_buf_tag *)exp->_jmpbuf,-1);
      }
      iVar4 = (int)*pcVar5 + iVar4 * 10 + -0x30;
      iVar3 = iVar3 * 10;
      pcVar5 = exp->_p;
    } while ((*(byte *)((long)*ppuVar2 + (long)*pcVar5 * 2 + 1) & 8) != 0);
  }
  return iVar4;
}

Assistant:

static int trex_parsenumber(TRex* exp) {
    int ret = *exp->_p - '0';
    int positions = 10;
    exp->_p++;
    while (isdigit((int)(*exp->_p))) {
        ret = ret * 10 + (*exp->_p++ - '0');
        if (positions == 1000000000)
            trex_error(exp, _SC("overflow in numeric constant"));
        positions *= 10;
    };
    return ret;
}